

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 gauden_dist_norm_global(gauden_t *g,int32 n_top,gauden_dist_t ***dist,uint8 *active)

{
  int local_38;
  int local_34;
  int32 best;
  int32 t;
  int32 f;
  int32 gid;
  uint8 *active_local;
  gauden_dist_t ***dist_local;
  int32 n_top_local;
  gauden_t *g_local;
  
  local_38 = -0x38000000;
  for (t = 0; t < g->n_mgau; t = t + 1) {
    if ((active == (uint8 *)0x0) || (active[t] != '\0')) {
      for (best = 0; best < g->n_feat; best = best + 1) {
        for (local_34 = 0; local_34 < n_top; local_34 = local_34 + 1) {
          if (local_38 < dist[t][best][local_34].dist) {
            local_38 = dist[t][best][local_34].dist;
          }
        }
      }
    }
  }
  for (t = 0; t < g->n_mgau; t = t + 1) {
    if ((active == (uint8 *)0x0) || (active[t] != '\0')) {
      for (best = 0; best < g->n_feat; best = best + 1) {
        for (local_34 = 0; local_34 < n_top; local_34 = local_34 + 1) {
          dist[t][best][local_34].dist = dist[t][best][local_34].dist - local_38;
        }
      }
    }
  }
  return local_38 * g->n_feat;
}

Assistant:

static int32
gauden_dist_norm_global(gauden_t * g,
                        int32 n_top, gauden_dist_t *** dist,
                        uint8 * active)
{
    int32 gid, f, t;
    int32 best;

    best = S3_LOGPROB_ZERO;

    for (gid = 0; gid < g->n_mgau; gid++) {
        if ((!active) || active[gid]) {
            for (f = 0; f < g->n_feat; f++) {
                for (t = 0; t < n_top; t++)
                    if (best < dist[gid][f][t].dist)
                        best = dist[gid][f][t].dist;
            }
        }
    }

    for (gid = 0; gid < g->n_mgau; gid++) {
        if ((!active) || active[gid]) {
            for (f = 0; f < g->n_feat; f++) {
                for (t = 0; t < n_top; t++)
                    dist[gid][f][t].dist -= best;
            }
        }
    }

    return (best * g->n_feat);  /* Scale factor applied to EVERY senone score */
}